

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O3

bool slang::ast::actuallyNeededCast(Type *type,Expression *operand)

{
  bool bVar1;
  ulong uVar2;
  ConditionalExpression *cond;
  Expression *pEVar3;
  
  do {
    uVar2 = (ulong)operand->kind;
    if (uVar2 < 0x29) {
      if (uVar2 != 0x25) {
        if ((0x10e38000000U >> (uVar2 & 0x3f) & 1) != 0) {
          return true;
        }
        if (uVar2 == 0xf) {
          bVar1 = Type::isUnpackedArray((operand->type).ptr);
          return bVar1;
        }
        goto LAB_0041df51;
      }
      pEVar3 = operand + 1;
    }
    else {
LAB_0041df51:
      if (operand->kind != ConditionalOp) {
        return false;
      }
      bVar1 = Type::isEquivalent(type,(Type *)((operand[1].syntax)->super_SyntaxNode).parent);
      if (!bVar1) {
        return true;
      }
      bVar1 = Type::isEquivalent(type,*(Type **)((long)operand[1].sourceRange.startLoc + 8));
      if (!bVar1) {
        return true;
      }
      bVar1 = actuallyNeededCast(type,(Expression *)operand[1].syntax);
      if (bVar1) {
        return true;
      }
      pEVar3 = (Expression *)&operand[1].sourceRange;
    }
    operand = *(Expression **)pEVar3;
  } while( true );
}

Assistant:

static bool actuallyNeededCast(const Type& type, const Expression& operand) {
    // Check whether a cast was needed for the given operand to
    // reach the final type. This is true when the operand requires
    // an assignment-like context to determine its result.
    switch (operand.kind) {
        case ExpressionKind::NewArray:
        case ExpressionKind::NewClass:
        case ExpressionKind::NewCovergroup:
        case ExpressionKind::SimpleAssignmentPattern:
        case ExpressionKind::StructuredAssignmentPattern:
        case ExpressionKind::ReplicatedAssignmentPattern:
        case ExpressionKind::TaggedUnion:
            return true;
        case ExpressionKind::Concatenation:
            return operand.type->isUnpackedArray();
        case ExpressionKind::MinTypMax:
            return actuallyNeededCast(type, operand.as<MinTypMaxExpression>().selected());
        case ExpressionKind::ConditionalOp: {
            auto& cond = operand.as<ConditionalExpression>();
            if (!type.isEquivalent(*cond.left().type) || !type.isEquivalent(*cond.right().type))
                return true;
            return actuallyNeededCast(type, cond.left()) || actuallyNeededCast(type, cond.right());
        }
        default:
            return false;
    }
}